

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O0

bool __thiscall
clickhouse::CodedInputStream::ReadRaw(CodedInputStream *this,void *buffer,size_t size)

{
  long in_RDX;
  void *in_RSI;
  void **in_RDI;
  size_t len;
  void *ptr;
  uint8_t *p;
  ZeroCopyInput *in_stack_ffffffffffffffd0;
  void *local_28;
  void *local_20;
  long local_18;
  
  local_20 = in_RSI;
  for (local_18 = in_RDX; local_18 != 0; local_18 = local_18 - (long)in_stack_ffffffffffffffd0) {
    in_stack_ffffffffffffffd0 =
         (ZeroCopyInput *)ZeroCopyInput::Next(in_stack_ffffffffffffffd0,in_RDI,0x1e4a94);
    memcpy(local_20,local_28,(size_t)in_stack_ffffffffffffffd0);
    local_20 = (void *)((long)&(in_stack_ffffffffffffffd0->super_InputStream)._vptr_InputStream +
                       (long)local_20);
  }
  return true;
}

Assistant:

bool CodedInputStream::ReadRaw(void* buffer, size_t size) {
    uint8_t* p = static_cast<uint8_t*>(buffer);

    while (size > 0) {
        const void* ptr;
        size_t len = input_->Next(&ptr, size);

        memcpy(p, ptr, len);

        p += len;
        size -= len;
    }

    return true;
}